

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_SpanIndices_Test::TestBody(PhraseTests_SpanIndices_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  size_type sVar4;
  reference rhs;
  AssertHelper local_a0;
  Message local_98;
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  int i;
  Message local_68 [3];
  size_type local_50;
  int local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Indices is;
  Span s;
  PhraseTests_SpanIndices_Test *this_local;
  
  is.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_2_ = 0;
  is.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_2_ = 3;
  Span::indices((Indices *)&gtest_ar.message_,
                (Span *)((long)&is.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4));
  local_44 = 3;
  local_50 = std::vector<short,_std::allocator<short>_>::size
                       ((vector<short,_std::allocator<short>_> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_40,"3","is.size()",&local_44,&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(local_68);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    for (gtest_ar_1.message_.ptr_._0_4_ = 0; uVar3 = (ulong)(int)gtest_ar_1.message_.ptr_,
        sVar4 = std::vector<short,_std::allocator<short>_>::size
                          ((vector<short,_std::allocator<short>_> *)&gtest_ar.message_),
        uVar3 < sVar4; gtest_ar_1.message_.ptr_._0_4_ = (int)gtest_ar_1.message_.ptr_ + 1) {
      local_8c = is.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_2_ + (int)gtest_ar_1.message_.ptr_;
      rhs = std::vector<short,_std::allocator<short>_>::operator[]
                      ((vector<short,_std::allocator<short>_> *)&gtest_ar.message_,
                       (long)(int)gtest_ar_1.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,short>
                ((EqHelper<false> *)local_88,"s.start + i","is[i]",&local_8c,rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                   ,0x62,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        testing::Message::~Message(&local_98);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    }
    gtest_ar_1.message_.ptr_._4_4_ = 0;
  }
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(PhraseTests, SpanIndices) {
  Span s{0, 3};
  auto is = s.indices();
  ASSERT_EQ(3, is.size());
  for (int i = 0; i < is.size(); i++) {
    EXPECT_EQ(s.start + i, is[i]);
  }
}